

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

Fts5Colset * sqlite3Fts5ParseColset(Fts5Parse *pParse,Fts5Colset *pColset,Fts5Token *p)

{
  uint uVar1;
  Fts5Config *pFVar2;
  char **ppcVar3;
  char *zLeft;
  int iVar4;
  uint uVar5;
  byte *z;
  Fts5Colset *pFVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  
  z = (byte *)sqlite3Fts5Strndup(&pParse->rc,p->p,p->n);
  if (pParse->rc == 0) {
    pFVar2 = pParse->pConfig;
    if ((*z - 0x22 < 0x3f) && ((0x4200000000000021U >> ((ulong)(*z - 0x22) & 0x3f) & 1) != 0)) {
      fts5Dequote((char *)z);
    }
    uVar5 = pFVar2->nCol;
    if ((int)uVar5 < 1) {
      uVar9 = 0;
    }
    else {
      ppcVar3 = pFVar2->azCol;
      uVar9 = 0;
      do {
        zLeft = ppcVar3[uVar9];
        if (zLeft != (char *)0x0) {
          iVar4 = sqlite3StrICmp(zLeft,(char *)z);
          if (iVar4 == 0) goto LAB_001bd039;
        }
        uVar9 = uVar9 + 1;
      } while (uVar5 != uVar9);
      uVar9 = (ulong)uVar5;
    }
LAB_001bd039:
    uVar8 = (uint)uVar9;
    if (uVar8 == uVar5) {
      pFVar6 = (Fts5Colset *)0x0;
      sqlite3Fts5ParseError(pParse,"no such column: %s",z);
    }
    else {
      if (pColset == (Fts5Colset *)0x0) {
        uVar5 = 0;
      }
      else {
        uVar5 = pColset->nCol;
      }
      iVar4 = sqlite3_initialize();
      if (iVar4 == 0) {
        pFVar6 = (Fts5Colset *)sqlite3Realloc(pColset,(long)(int)uVar5 * 4 + 8);
      }
      else {
        pFVar6 = (Fts5Colset *)0x0;
      }
      if (pFVar6 == (Fts5Colset *)0x0) {
        pParse->rc = 7;
      }
      else {
        uVar9 = 0;
        if (0 < (int)uVar5) {
          do {
            uVar1 = pFVar6->aiCol[uVar9];
            if (uVar1 == uVar8) goto LAB_001bd0e3;
            if (uVar1 != uVar8 && (int)uVar8 <= (int)uVar1) goto LAB_001bd0b0;
            uVar9 = uVar9 + 1;
          } while (uVar5 != uVar9);
          uVar9 = (ulong)uVar5;
        }
LAB_001bd0b0:
        if ((int)uVar9 < (int)uVar5) {
          lVar7 = (long)(int)uVar5;
          do {
            pFVar6->aiCol[lVar7] = pFVar6->aiCol[lVar7 + -1];
            lVar7 = lVar7 + -1;
          } while ((int)uVar9 < lVar7);
        }
        pFVar6->aiCol[uVar9 & 0xffffffff] = uVar8;
        pFVar6->nCol = uVar5 + 1;
      }
    }
LAB_001bd0e3:
    sqlite3_free(z);
  }
  else {
    pFVar6 = (Fts5Colset *)0x0;
  }
  if (pFVar6 == (Fts5Colset *)0x0) {
    sqlite3_free(pColset);
  }
  return pFVar6;
}

Assistant:

static Fts5Colset *sqlite3Fts5ParseColset(
  Fts5Parse *pParse,              /* Store SQLITE_NOMEM here if required */
  Fts5Colset *pColset,            /* Existing colset object */
  Fts5Token *p
){
  Fts5Colset *pRet = 0;
  int iCol;
  char *z;                        /* Dequoted copy of token p */

  z = sqlite3Fts5Strndup(&pParse->rc, p->p, p->n);
  if( pParse->rc==SQLITE_OK ){
    Fts5Config *pConfig = pParse->pConfig;
    sqlite3Fts5Dequote(z);
    for(iCol=0; iCol<pConfig->nCol; iCol++){
      if( 0==sqlite3_stricmp(pConfig->azCol[iCol], z) ) break;
    }
    if( iCol==pConfig->nCol ){
      sqlite3Fts5ParseError(pParse, "no such column: %s", z);
    }else{
      pRet = fts5ParseColset(pParse, pColset, iCol);
    }
    sqlite3_free(z);
  }

  if( pRet==0 ){
    assert( pParse->rc!=SQLITE_OK );
    sqlite3_free(pColset);
  }

  return pRet;
}